

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

string * __thiscall
tinyusdz::PrimMetas::get_kind_abi_cxx11_(string *__return_storage_ptr__,PrimMetas *this)

{
  storage_t<tinyusdz::Kind> sVar1;
  pointer pcVar2;
  Kind in_EDX;
  
  if ((this->kind).has_value_ == true) {
    sVar1 = (this->kind).contained;
    if (sVar1 == (storage_t<tinyusdz::Kind>)0x6) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (this->_kind_str)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->_kind_str)._M_string_length
                );
    }
    else {
      tinyusdz::to_string_abi_cxx11_(__return_storage_ptr__,(tinyusdz *)(ulong)(uint)sVar1,in_EDX);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string PrimMeta::get_kind() const {

  if (kind.has_value()) {
    if (kind.value() == Kind::UserDef) {
      return _kind_str;
    } else {
      return to_string(kind.value());
    }
  }

  return "";
}